

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O0

void __thiscall Lodtalk::NativeError::~NativeError(NativeError *this)

{
  NativeError *this_local;
  
  ~NativeError(this);
  operator_delete(this);
  return;
}

Assistant:

class LODTALK_VM_EXPORT NativeError: public NativeException
{
public:
	NativeError(const std::string &errorMessage) noexcept
		: errorMessage(errorMessage) {}

	virtual const char* what() const noexcept
	{
		return errorMessage.c_str();
	}

private:
	std::string errorMessage;
}